

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O3

void __thiscall libtorrent::dht::rpc_manager::~rpc_manager(rpc_manager *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  __node_base *p_Var4;
  
  this->field_0xb7 = this->field_0xb7 | 0x80;
  p_Var4 = &(this->m_transactions)._M_h._M_before_begin;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    observer::abort(*(observer **)&((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor);
  }
  p_Var2 = (this->m_sock).m_sock.
           super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
    }
  }
  ::std::
  _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::~_Hashtable(&(this->m_transactions)._M_h);
  boost::pool<libtorrent::aux::allocator_new_delete>::purge_memory(&this->m_pool_allocator);
  return;
}

Assistant:

rpc_manager::~rpc_manager()
{
	TORRENT_ASSERT(!m_destructing);
	m_destructing = true;

	for (auto const& t : m_transactions)
		t.second->abort();
}